

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_aggregate.cpp
# Opt level: O1

void duckdb::RowOperations::InitializeStates
               (TupleDataLayout *layout,Vector *addresses,SelectionVector *sel,idx_t count)

{
  pointer pAVar1;
  data_ptr_t pdVar2;
  long lVar3;
  aggregate_initialize_t p_Var4;
  ulong uVar5;
  const_reference pvVar6;
  size_type __n;
  idx_t i;
  ulong uVar7;
  pointer pAVar8;
  
  if (count != 0) {
    pAVar8 = (layout->aggregates).
             super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
             super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (layout->aggregates).
             super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
             super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pAVar8 != pAVar1) {
      pdVar2 = addresses->data;
      __n = ((long)(layout->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      do {
        uVar7 = 0;
        do {
          uVar5 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)sel->sel_vector[uVar7];
          }
          lVar3 = *(long *)(pdVar2 + uVar5 * 8);
          p_Var4 = (pAVar8->function).initialize;
          pvVar6 = vector<unsigned_long,_true>::operator[](&layout->offsets,__n);
          (*p_Var4)(&pAVar8->function,(data_ptr_t)(lVar3 + *pvVar6));
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
        __n = __n + 1;
        pAVar8 = pAVar8 + 1;
      } while (pAVar8 != pAVar1);
    }
  }
  return;
}

Assistant:

void RowOperations::InitializeStates(TupleDataLayout &layout, Vector &addresses, const SelectionVector &sel,
                                     idx_t count) {
	if (count == 0) {
		return;
	}
	auto pointers = FlatVector::GetData<data_ptr_t>(addresses);
	auto &offsets = layout.GetOffsets();
	auto aggr_idx = layout.ColumnCount();

	for (const auto &aggr : layout.GetAggregates()) {
		for (idx_t i = 0; i < count; ++i) {
			auto row_idx = sel.get_index(i);
			auto row = pointers[row_idx];
			aggr.function.initialize(aggr.function, row + offsets[aggr_idx]);
		}
		++aggr_idx;
	}
}